

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::mergeTracks(MidiFile *this,int aTrack1,int aTrack2)

{
  MidiEventList *this_00;
  value_type pMVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  MidiEventList *this_01;
  reference ppMVar5;
  MidiEvent *pMVar6;
  int local_44;
  int local_40;
  int j_1;
  int i_1;
  int j;
  int i;
  int length;
  int oldTimeState;
  MidiEventList *mergedTrack;
  int aTrack2_local;
  int aTrack1_local;
  MidiFile *this_local;
  
  this_01 = (MidiEventList *)operator_new(0x18);
  MidiEventList::MidiEventList(this_01);
  iVar2 = getTickState(this);
  if (iVar2 == 0) {
    makeAbsoluteTicks(this);
  }
  iVar3 = getNumTracks(this);
  i_1 = 0;
  while( true ) {
    ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)aTrack1);
    iVar4 = MidiEventList::size(*ppMVar5);
    if (iVar4 <= i_1) break;
    ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)aTrack1);
    pMVar6 = MidiEventList::operator[](*ppMVar5,i_1);
    MidiEventList::push_back(this_01,pMVar6);
    i_1 = i_1 + 1;
  }
  j_1 = 0;
  while( true ) {
    ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)aTrack2);
    iVar4 = MidiEventList::size(*ppMVar5);
    if (iVar4 <= j_1) break;
    ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)aTrack2);
    pMVar6 = MidiEventList::operator[](*ppMVar5,j_1);
    pMVar6->track = aTrack1;
    ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)aTrack2);
    pMVar6 = MidiEventList::operator[](*ppMVar5,j_1);
    MidiEventList::push_back(this_01,pMVar6);
    j_1 = j_1 + 1;
  }
  MidiEventList::sort(this_01);
  ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                      (&this->m_events,(long)aTrack1);
  this_00 = *ppMVar5;
  if (this_00 != (MidiEventList *)0x0) {
    MidiEventList::~MidiEventList(this_00);
    operator_delete(this_00);
  }
  ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                      (&this->m_events,(long)aTrack1);
  *ppMVar5 = this_01;
  for (local_40 = aTrack2; local_40 < iVar3 + -1; local_40 = local_40 + 1) {
    ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)(local_40 + 1));
    pMVar1 = *ppMVar5;
    ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)local_40);
    *ppMVar5 = pMVar1;
    local_44 = 0;
    while( true ) {
      ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,(long)local_40);
      iVar4 = MidiEventList::size(*ppMVar5);
      if (iVar4 <= local_44) break;
      ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,(long)local_40);
      pMVar6 = MidiEventList::operator[](*ppMVar5,local_44);
      pMVar6->track = local_40;
      local_44 = local_44 + 1;
    }
  }
  ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                      (&this->m_events,(long)(iVar3 + -1));
  *ppMVar5 = (value_type)0x0;
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
            (&this->m_events,(long)(iVar3 + -1));
  if (iVar2 == 0) {
    deltaTicks(this);
  }
  return;
}

Assistant:

void MidiFile::mergeTracks(int aTrack1, int aTrack2) {
	MidiEventList* mergedTrack;
	mergedTrack = new MidiEventList;
	int oldTimeState = getTickState();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeAbsoluteTicks();
	}
	int length = getNumTracks();
	for (int i=0; i<(int)m_events[aTrack1]->size(); i++) {
		mergedTrack->push_back((*m_events[aTrack1])[i]);
	}
	for (int j=0; j<(int)m_events[aTrack2]->size(); j++) {
		(*m_events[aTrack2])[j].track = aTrack1;
		mergedTrack->push_back((*m_events[aTrack2])[j]);
	}

	mergedTrack->sort();

	delete m_events[aTrack1];

	m_events[aTrack1] = mergedTrack;

	for (int i=aTrack2; i<length-1; i++) {
		m_events[i] = m_events[i+1];
		for (int j=0; j<(int)m_events[i]->size(); j++) {
			(*m_events[i])[j].track = i;
		}
	}

	m_events[length-1] = NULL;
	m_events.resize(length-1);

	if (oldTimeState == TIME_STATE_DELTA) {
		deltaTicks();
	}
}